

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  BVH *bvh;
  size_t sVar1;
  Geometry *pGVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  undefined4 uVar11;
  size_t sVar12;
  size_t sVar13;
  int iVar14;
  RTCIntersectArguments *pRVar15;
  long lVar16;
  ulong uVar17;
  NodeRef root;
  long lVar18;
  uint uVar19;
  NodeRef *pNVar20;
  vfloat<4> *pvVar21;
  vfloat<4> *pvVar22;
  float fVar23;
  float fVar32;
  float fVar33;
  vint4 bi_1;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar34;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar35;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  uint uVar36;
  float fVar37;
  float fVar38;
  uint uVar43;
  float fVar46;
  vint4 bi;
  float fVar44;
  float fVar45;
  float fVar47;
  float fVar48;
  float fVar49;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar50;
  float fVar51;
  float fVar52;
  vint4 ai;
  float fVar53;
  float fVar54;
  float fVar57;
  float fVar58;
  vint4 ai_1;
  undefined1 auVar55 [16];
  float fVar59;
  undefined1 auVar56 [16];
  float fVar60;
  float fVar62;
  float fVar63;
  vint4 ai_3;
  undefined1 auVar61 [16];
  float fVar64;
  uint uVar68;
  vint4 bi_2;
  undefined1 auVar65 [16];
  uint uVar69;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar70;
  float fVar71;
  float fVar75;
  float fVar76;
  float fVar77;
  vint4 bi_3;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar78;
  undefined1 auVar74 [16];
  uint uVar79;
  float fVar80;
  uint uVar81;
  uint uVar82;
  vint4 ai_2;
  uint uVar83;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  uint uVar86;
  uint uVar87;
  uint uVar88;
  uint uVar89;
  uint uVar90;
  uint uVar91;
  uint uVar92;
  Precalculations pre;
  uint local_1918;
  uint uStack_1914;
  uint uStack_1910;
  uint uStack_190c;
  vbool<4> terminated;
  undefined1 local_18c8 [16];
  float local_1888;
  float fStack_1884;
  float fStack_1880;
  float fStack_187c;
  float local_1878;
  float fStack_1874;
  float fStack_1870;
  float fStack_186c;
  TravRayK<4,_false> tray;
  float local_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  uint local_1728;
  uint uStack_1724;
  uint uStack_1720;
  uint uStack_171c;
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  float local_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  float local_16e8;
  float fStack_16e4;
  float fStack_16e0;
  float fStack_16dc;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar39 [16];
  
  uVar7 = mm_lookupmask_ps._8_8_;
  uVar6 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    pRVar15 = (RTCIntersectArguments *)ray;
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       (pRVar15 = context->args,
       (pRVar15->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar55 = *(undefined1 (*) [16])(ray + 0x80);
    auVar61._0_12_ = ZEXT812(0);
    auVar61._12_4_ = 0;
    uVar36 = -(uint)((valid_i->field_0).i[0] == -1 && 0.0 <= auVar55._0_4_);
    uVar43 = -(uint)((valid_i->field_0).i[1] == -1 && 0.0 <= auVar55._4_4_);
    auVar39._0_8_ = CONCAT44(uVar43,uVar36);
    auVar39._8_4_ = -(uint)((valid_i->field_0).i[2] == -1 && 0.0 <= auVar55._8_4_);
    auVar39._12_4_ = -(uint)((valid_i->field_0).i[3] == -1 && 0.0 <= auVar55._12_4_);
    iVar14 = movmskps((int)pRVar15,auVar39);
    if (iVar14 != 0) {
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      fVar37 = (float)DAT_01f4bd50;
      fVar44 = DAT_01f4bd50._4_4_;
      fVar46 = DAT_01f4bd50._8_4_;
      fVar48 = DAT_01f4bd50._12_4_;
      auVar25._4_4_ = -(uint)(ABS(tray.dir.field_0._4_4_) < fVar44);
      auVar25._0_4_ = -(uint)(ABS(tray.dir.field_0._0_4_) < fVar37);
      auVar25._8_4_ = -(uint)(ABS(tray.dir.field_0._8_4_) < fVar46);
      auVar25._12_4_ = -(uint)(ABS(tray.dir.field_0._12_4_) < fVar48);
      auVar84 = blendvps((undefined1  [16])tray.dir.field_0.field_0.x.field_0,_DAT_01f4bd50,auVar25)
      ;
      auVar65._4_4_ = -(uint)(ABS(tray.dir.field_0._20_4_) < fVar44);
      auVar65._0_4_ = -(uint)(ABS(tray.dir.field_0._16_4_) < fVar37);
      auVar65._8_4_ = -(uint)(ABS(tray.dir.field_0._24_4_) < fVar46);
      auVar65._12_4_ = -(uint)(ABS(tray.dir.field_0._28_4_) < fVar48);
      auVar72 = blendvps((undefined1  [16])tray.dir.field_0.field_0.y.field_0,_DAT_01f4bd50,auVar65)
      ;
      auVar24._4_4_ = -(uint)(ABS(tray.dir.field_0._36_4_) < fVar44);
      auVar24._0_4_ = -(uint)(ABS(tray.dir.field_0._32_4_) < fVar37);
      auVar24._8_4_ = -(uint)(ABS(tray.dir.field_0._40_4_) < fVar46);
      auVar24._12_4_ = -(uint)(ABS(tray.dir.field_0._44_4_) < fVar48);
      auVar65 = blendvps((undefined1  [16])tray.dir.field_0.field_0.z.field_0,_DAT_01f4bd50,auVar24)
      ;
      auVar25 = rcpps(auVar24,auVar84);
      fVar37 = auVar25._0_4_;
      auVar85._0_4_ = auVar84._0_4_ * fVar37;
      fVar44 = auVar25._4_4_;
      auVar85._4_4_ = auVar84._4_4_ * fVar44;
      fVar46 = auVar25._8_4_;
      auVar85._8_4_ = auVar84._8_4_ * fVar46;
      fVar48 = auVar25._12_4_;
      auVar85._12_4_ = auVar84._12_4_ * fVar48;
      tray.rdir.field_0._0_4_ = (1.0 - auVar85._0_4_) * fVar37 + fVar37;
      tray.rdir.field_0._4_4_ = (1.0 - auVar85._4_4_) * fVar44 + fVar44;
      tray.rdir.field_0._8_4_ = (1.0 - auVar85._8_4_) * fVar46 + fVar46;
      tray.rdir.field_0._12_4_ = (1.0 - auVar85._12_4_) * fVar48 + fVar48;
      auVar25 = rcpps(auVar85,auVar72);
      fVar37 = auVar25._0_4_;
      auVar73._0_4_ = auVar72._0_4_ * fVar37;
      fVar44 = auVar25._4_4_;
      auVar73._4_4_ = auVar72._4_4_ * fVar44;
      fVar46 = auVar25._8_4_;
      auVar73._8_4_ = auVar72._8_4_ * fVar46;
      fVar48 = auVar25._12_4_;
      auVar73._12_4_ = auVar72._12_4_ * fVar48;
      tray.rdir.field_0._16_4_ = (1.0 - auVar73._0_4_) * fVar37 + fVar37;
      tray.rdir.field_0._20_4_ = (1.0 - auVar73._4_4_) * fVar44 + fVar44;
      tray.rdir.field_0._24_4_ = (1.0 - auVar73._8_4_) * fVar46 + fVar46;
      tray.rdir.field_0._28_4_ = (1.0 - auVar73._12_4_) * fVar48 + fVar48;
      auVar25 = rcpps(auVar73,auVar65);
      fVar37 = auVar25._0_4_;
      fVar44 = auVar25._4_4_;
      fVar46 = auVar25._8_4_;
      fVar48 = auVar25._12_4_;
      tray.rdir.field_0._32_4_ = (1.0 - auVar65._0_4_ * fVar37) * fVar37 + fVar37;
      tray.rdir.field_0._36_4_ = (1.0 - auVar65._4_4_ * fVar44) * fVar44 + fVar44;
      tray.rdir.field_0._40_4_ = (1.0 - auVar65._8_4_ * fVar46) * fVar46 + fVar46;
      tray.rdir.field_0._44_4_ = (1.0 - auVar65._12_4_ * fVar48) * fVar48 + fVar48;
      tray.nearXYZ.field_0._0_4_ = -(uint)((float)tray.rdir.field_0._0_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._4_4_ = -(uint)((float)tray.rdir.field_0._4_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._8_4_ = -(uint)((float)tray.rdir.field_0._8_4_ < 0.0) & 0x10;
      tray.nearXYZ.field_0._12_4_ = -(uint)((float)tray.rdir.field_0._12_4_ < 0.0) & 0x10;
      auVar72._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._20_4_);
      auVar72._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._16_4_);
      auVar72._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._24_4_);
      auVar72._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._28_4_);
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)blendvps(_DAT_01f79fd0,_DAT_01f57210,auVar72);
      auVar84._4_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._36_4_);
      auVar84._0_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._32_4_);
      auVar84._8_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._40_4_);
      auVar84._12_4_ = -(uint)(0.0 <= (float)tray.rdir.field_0._44_4_);
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)blendvps(_DAT_01f79ff0,_DAT_01f79fe0,auVar84);
      auVar25 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar61);
      auVar55 = maxps(auVar55,auVar61);
      fVar37 = (float)DAT_01f45a30;
      fVar44 = DAT_01f45a30._4_4_;
      fVar46 = DAT_01f45a30._8_4_;
      fVar48 = DAT_01f45a30._12_4_;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           blendvps((undefined1  [16])_DAT_01f45a30,auVar25,auVar39);
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)blendvps(_DAT_01f45a40,auVar55,auVar39);
      terminated.field_0._0_8_ = auVar39._0_8_ ^ 0xffffffffffffffff;
      terminated.field_0.i[2] = auVar39._8_4_ ^ 0xffffffff;
      terminated.field_0.i[3] = auVar39._12_4_ ^ 0xffffffff;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar19 = 3;
        sVar13 = 0;
      }
      else {
        sVar13 = CONCAT71((int7)((ulong)context->args >> 8),
                          *(byte *)((long)&context->args->flags + 2)) & 0xffffffffffffff01;
        uVar19 = ((char)sVar13 == '\0') + 2;
      }
      pNVar20 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01f45a30;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      uVar9 = 0x2223f80;
      pvVar21 = stack_near + 2;
LAB_006bd787:
      do {
        do {
          root.ptr = pNVar20[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_006bded3;
          pNVar20 = pNVar20 + -1;
          pvVar22 = pvVar21 + -1;
          fVar71 = (pvVar22->field_0).v[0];
          fVar76 = pvVar21[-1].field_0.v[1];
          fVar35 = pvVar21[-1].field_0.v[2];
          fVar80 = pvVar21[-1].field_0.v[3];
          auVar55._4_4_ = -(uint)(fVar76 < tray.tfar.field_0.v[1]);
          auVar55._0_4_ = -(uint)(fVar71 < tray.tfar.field_0.v[0]);
          auVar55._8_4_ = -(uint)(fVar35 < tray.tfar.field_0.v[2]);
          auVar55._12_4_ = -(uint)(fVar80 < tray.tfar.field_0.v[3]);
          uVar9 = movmskps(uVar9,auVar55);
          pvVar21 = pvVar22;
        } while (uVar9 == 0);
        uVar17 = (ulong)(byte)uVar9;
        uVar10 = POPCOUNT(uVar9 & 0xff);
        uVar9 = uVar10;
        if (uVar19 < uVar10) {
LAB_006bd7c7:
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_006bded3;
              auVar28._4_4_ = -(uint)(fVar76 < tray.tfar.field_0.v[1]);
              auVar28._0_4_ = -(uint)(fVar71 < tray.tfar.field_0.v[0]);
              auVar28._8_4_ = -(uint)(fVar35 < tray.tfar.field_0.v[2]);
              auVar28._12_4_ = -(uint)(fVar80 < tray.tfar.field_0.v[3]);
              uVar9 = movmskps(uVar9,auVar28);
              pvVar21 = pvVar22;
              if (uVar9 == 0) goto LAB_006bd787;
              sVar12 = (ulong)((uint)root.ptr & 0xf) - 8;
              local_18c8._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
              local_18c8._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
              local_18c8._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
              lVar18 = (root.ptr & 0xfffffffffffffff0) + 0x90;
              sVar13 = 0;
              goto LAB_006bda42;
            }
            sVar12 = 8;
            fVar71 = fVar37;
            fVar76 = fVar44;
            fVar35 = fVar46;
            fVar80 = fVar48;
            for (sVar13 = 0;
                (sVar13 != 4 &&
                (sVar1 = *(size_t *)((root.ptr & 0xfffffffffffffff0) + sVar13 * 8), sVar1 != 8));
                sVar13 = sVar13 + 1) {
              fVar78 = *(float *)(root.ptr + 0x20 + sVar13 * 4);
              fVar23 = *(float *)(root.ptr + 0x30 + sVar13 * 4);
              fVar32 = *(float *)(root.ptr + 0x40 + sVar13 * 4);
              fVar34 = *(float *)(root.ptr + 0x50 + sVar13 * 4);
              fVar50 = (fVar78 - (float)tray.org.field_0._0_4_) * (float)tray.rdir.field_0._0_4_;
              fVar51 = (fVar78 - (float)tray.org.field_0._4_4_) * (float)tray.rdir.field_0._4_4_;
              fVar52 = (fVar78 - (float)tray.org.field_0._8_4_) * (float)tray.rdir.field_0._8_4_;
              fVar53 = (fVar78 - (float)tray.org.field_0._12_4_) * (float)tray.rdir.field_0._12_4_;
              fVar54 = (fVar32 - (float)tray.org.field_0._16_4_) * (float)tray.rdir.field_0._16_4_;
              fVar57 = (fVar32 - (float)tray.org.field_0._20_4_) * (float)tray.rdir.field_0._20_4_;
              fVar58 = (fVar32 - (float)tray.org.field_0._24_4_) * (float)tray.rdir.field_0._24_4_;
              fVar59 = (fVar32 - (float)tray.org.field_0._28_4_) * (float)tray.rdir.field_0._28_4_;
              fVar78 = *(float *)(root.ptr + 0x60 + sVar13 * 4);
              fVar60 = (fVar78 - (float)tray.org.field_0._32_4_) * (float)tray.rdir.field_0._32_4_;
              fVar62 = (fVar78 - (float)tray.org.field_0._36_4_) * (float)tray.rdir.field_0._36_4_;
              fVar63 = (fVar78 - (float)tray.org.field_0._40_4_) * (float)tray.rdir.field_0._40_4_;
              fVar64 = (fVar78 - (float)tray.org.field_0._44_4_) * (float)tray.rdir.field_0._44_4_;
              fVar38 = (fVar23 - (float)tray.org.field_0._0_4_) * (float)tray.rdir.field_0._0_4_;
              fVar45 = (fVar23 - (float)tray.org.field_0._4_4_) * (float)tray.rdir.field_0._4_4_;
              fVar47 = (fVar23 - (float)tray.org.field_0._8_4_) * (float)tray.rdir.field_0._8_4_;
              fVar49 = (fVar23 - (float)tray.org.field_0._12_4_) * (float)tray.rdir.field_0._12_4_;
              fVar23 = (fVar34 - (float)tray.org.field_0._16_4_) * (float)tray.rdir.field_0._16_4_;
              fVar32 = (fVar34 - (float)tray.org.field_0._20_4_) * (float)tray.rdir.field_0._20_4_;
              fVar33 = (fVar34 - (float)tray.org.field_0._24_4_) * (float)tray.rdir.field_0._24_4_;
              fVar34 = (fVar34 - (float)tray.org.field_0._28_4_) * (float)tray.rdir.field_0._28_4_;
              fVar78 = *(float *)(root.ptr + 0x70 + sVar13 * 4);
              fVar70 = (fVar78 - (float)tray.org.field_0._32_4_) * (float)tray.rdir.field_0._32_4_;
              fVar75 = (fVar78 - (float)tray.org.field_0._36_4_) * (float)tray.rdir.field_0._36_4_;
              fVar77 = (fVar78 - (float)tray.org.field_0._40_4_) * (float)tray.rdir.field_0._40_4_;
              fVar78 = (fVar78 - (float)tray.org.field_0._44_4_) * (float)tray.rdir.field_0._44_4_;
              uVar9 = (uint)((int)fVar38 < (int)fVar50) * (int)fVar38 |
                      (uint)((int)fVar38 >= (int)fVar50) * (int)fVar50;
              uVar10 = (uint)((int)fVar45 < (int)fVar51) * (int)fVar45 |
                       (uint)((int)fVar45 >= (int)fVar51) * (int)fVar51;
              uVar68 = (uint)((int)fVar47 < (int)fVar52) * (int)fVar47 |
                       (uint)((int)fVar47 >= (int)fVar52) * (int)fVar52;
              uVar69 = (uint)((int)fVar49 < (int)fVar53) * (int)fVar49 |
                       (uint)((int)fVar49 >= (int)fVar53) * (int)fVar53;
              uVar79 = (uint)((int)fVar23 < (int)fVar54) * (int)fVar23 |
                       (uint)((int)fVar23 >= (int)fVar54) * (int)fVar54;
              uVar81 = (uint)((int)fVar32 < (int)fVar57) * (int)fVar32 |
                       (uint)((int)fVar32 >= (int)fVar57) * (int)fVar57;
              uVar82 = (uint)((int)fVar33 < (int)fVar58) * (int)fVar33 |
                       (uint)((int)fVar33 >= (int)fVar58) * (int)fVar58;
              uVar83 = (uint)((int)fVar34 < (int)fVar59) * (int)fVar34 |
                       (uint)((int)fVar34 >= (int)fVar59) * (int)fVar59;
              uVar79 = ((int)uVar79 < (int)uVar9) * uVar9 | ((int)uVar79 >= (int)uVar9) * uVar79;
              uVar81 = ((int)uVar81 < (int)uVar10) * uVar10 | ((int)uVar81 >= (int)uVar10) * uVar81;
              uVar82 = ((int)uVar82 < (int)uVar68) * uVar68 | ((int)uVar82 >= (int)uVar68) * uVar82;
              uVar83 = ((int)uVar83 < (int)uVar69) * uVar69 | ((int)uVar83 >= (int)uVar69) * uVar83;
              uVar9 = (uint)((int)fVar70 < (int)fVar60) * (int)fVar70 |
                      (uint)((int)fVar70 >= (int)fVar60) * (int)fVar60;
              uVar10 = (uint)((int)fVar75 < (int)fVar62) * (int)fVar75 |
                       (uint)((int)fVar75 >= (int)fVar62) * (int)fVar62;
              uVar68 = (uint)((int)fVar77 < (int)fVar63) * (int)fVar77 |
                       (uint)((int)fVar77 >= (int)fVar63) * (int)fVar63;
              uVar69 = (uint)((int)fVar78 < (int)fVar64) * (int)fVar78 |
                       (uint)((int)fVar78 >= (int)fVar64) * (int)fVar64;
              auVar66._0_4_ =
                   ((int)uVar9 < (int)uVar79) * uVar79 | ((int)uVar9 >= (int)uVar79) * uVar9;
              auVar66._4_4_ =
                   ((int)uVar10 < (int)uVar81) * uVar81 | ((int)uVar10 >= (int)uVar81) * uVar10;
              auVar66._8_4_ =
                   ((int)uVar68 < (int)uVar82) * uVar82 | ((int)uVar68 >= (int)uVar82) * uVar68;
              auVar66._12_4_ =
                   ((int)uVar69 < (int)uVar83) * uVar83 | ((int)uVar69 >= (int)uVar83) * uVar69;
              uVar79 = (uint)((int)fVar38 < (int)fVar50) * (int)fVar50 |
                       (uint)((int)fVar38 >= (int)fVar50) * (int)fVar38;
              uVar81 = (uint)((int)fVar45 < (int)fVar51) * (int)fVar51 |
                       (uint)((int)fVar45 >= (int)fVar51) * (int)fVar45;
              uVar82 = (uint)((int)fVar47 < (int)fVar52) * (int)fVar52 |
                       (uint)((int)fVar47 >= (int)fVar52) * (int)fVar47;
              uVar83 = (uint)((int)fVar49 < (int)fVar53) * (int)fVar53 |
                       (uint)((int)fVar49 >= (int)fVar53) * (int)fVar49;
              uVar9 = (uint)((int)fVar23 < (int)fVar54) * (int)fVar54 |
                      (uint)((int)fVar23 >= (int)fVar54) * (int)fVar23;
              uVar10 = (uint)((int)fVar32 < (int)fVar57) * (int)fVar57 |
                       (uint)((int)fVar32 >= (int)fVar57) * (int)fVar32;
              uVar68 = (uint)((int)fVar33 < (int)fVar58) * (int)fVar58 |
                       (uint)((int)fVar33 >= (int)fVar58) * (int)fVar33;
              uVar69 = (uint)((int)fVar34 < (int)fVar59) * (int)fVar59 |
                       (uint)((int)fVar34 >= (int)fVar59) * (int)fVar34;
              uVar9 = ((int)uVar79 < (int)uVar9) * uVar79 | ((int)uVar79 >= (int)uVar9) * uVar9;
              uVar10 = ((int)uVar81 < (int)uVar10) * uVar81 | ((int)uVar81 >= (int)uVar10) * uVar10;
              uVar68 = ((int)uVar82 < (int)uVar68) * uVar82 | ((int)uVar82 >= (int)uVar68) * uVar68;
              uVar69 = ((int)uVar83 < (int)uVar69) * uVar83 | ((int)uVar83 >= (int)uVar69) * uVar69;
              uVar79 = (uint)((int)fVar70 < (int)fVar60) * (int)fVar60 |
                       (uint)((int)fVar70 >= (int)fVar60) * (int)fVar70;
              uVar81 = (uint)((int)fVar75 < (int)fVar62) * (int)fVar62 |
                       (uint)((int)fVar75 >= (int)fVar62) * (int)fVar75;
              uVar82 = (uint)((int)fVar77 < (int)fVar63) * (int)fVar63 |
                       (uint)((int)fVar77 >= (int)fVar63) * (int)fVar77;
              uVar83 = (uint)((int)fVar78 < (int)fVar64) * (int)fVar64 |
                       (uint)((int)fVar78 >= (int)fVar64) * (int)fVar78;
              uVar9 = ((int)uVar9 < (int)uVar79) * uVar9 | ((int)uVar9 >= (int)uVar79) * uVar79;
              uVar10 = ((int)uVar10 < (int)uVar81) * uVar10 | ((int)uVar10 >= (int)uVar81) * uVar81;
              uVar68 = ((int)uVar68 < (int)uVar82) * uVar68 | ((int)uVar68 >= (int)uVar82) * uVar82;
              uVar69 = ((int)uVar69 < (int)uVar83) * uVar69 | ((int)uVar69 >= (int)uVar83) * uVar83;
              auVar26._4_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[1] < (int)auVar66._4_4_) * auVar66._4_4_ |
                                  (uint)(tray.tnear.field_0.i[1] >= (int)auVar66._4_4_) *
                                  tray.tnear.field_0.i[1]) <=
                          (float)((uint)(tray.tfar.field_0.i[1] < (int)uVar10) *
                                  tray.tfar.field_0.i[1] |
                                 (tray.tfar.field_0.i[1] >= (int)uVar10) * uVar10));
              auVar26._0_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[0] < (int)auVar66._0_4_) * auVar66._0_4_ |
                                  (uint)(tray.tnear.field_0.i[0] >= (int)auVar66._0_4_) *
                                  tray.tnear.field_0.i[0]) <=
                          (float)((uint)(tray.tfar.field_0.i[0] < (int)uVar9) *
                                  tray.tfar.field_0.i[0] |
                                 (tray.tfar.field_0.i[0] >= (int)uVar9) * uVar9));
              auVar26._8_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[2] < (int)auVar66._8_4_) * auVar66._8_4_ |
                                  (uint)(tray.tnear.field_0.i[2] >= (int)auVar66._8_4_) *
                                  tray.tnear.field_0.i[2]) <=
                          (float)((uint)(tray.tfar.field_0.i[2] < (int)uVar68) *
                                  tray.tfar.field_0.i[2] |
                                 (tray.tfar.field_0.i[2] >= (int)uVar68) * uVar68));
              auVar26._12_4_ =
                   -(uint)((float)((tray.tnear.field_0.i[3] < (int)auVar66._12_4_) * auVar66._12_4_
                                  | (uint)(tray.tnear.field_0.i[3] >= (int)auVar66._12_4_) *
                                    tray.tnear.field_0.i[3]) <=
                          (float)((uint)(tray.tfar.field_0.i[3] < (int)uVar69) *
                                  tray.tfar.field_0.i[3] |
                                 (tray.tfar.field_0.i[3] >= (int)uVar69) * uVar69));
              uVar9 = movmskps((int)valid_i,auVar26);
              valid_i = (vint<4> *)(ulong)uVar9;
              if (uVar9 == 0) {
                auVar41._4_4_ = fVar76;
                auVar41._0_4_ = fVar71;
                auVar41._8_4_ = fVar35;
                auVar41._12_4_ = fVar80;
                sVar1 = sVar12;
              }
              else {
                auVar40._4_4_ = fVar44;
                auVar40._0_4_ = fVar37;
                auVar40._8_4_ = fVar46;
                auVar40._12_4_ = fVar48;
                auVar41 = blendvps(auVar40,auVar66,auVar26);
                if (sVar12 != 8) {
                  pNVar20->ptr = sVar12;
                  pNVar20 = pNVar20 + 1;
                  (pvVar22->field_0).v[0] = fVar71;
                  (pvVar22->field_0).v[1] = fVar76;
                  (pvVar22->field_0).v[2] = fVar35;
                  (pvVar22->field_0).v[3] = fVar80;
                  pvVar22 = pvVar22 + 1;
                }
              }
              sVar12 = sVar1;
              fVar71 = auVar41._0_4_;
              fVar76 = auVar41._4_4_;
              fVar35 = auVar41._8_4_;
              fVar80 = auVar41._12_4_;
            }
            if (sVar12 == 8) goto LAB_006bd95e;
            auVar27._4_4_ = -(uint)(fVar76 < tray.tfar.field_0.v[1]);
            auVar27._0_4_ = -(uint)(fVar71 < tray.tfar.field_0.v[0]);
            auVar27._8_4_ = -(uint)(fVar35 < tray.tfar.field_0.v[2]);
            auVar27._12_4_ = -(uint)(fVar80 < tray.tfar.field_0.v[3]);
            uVar11 = movmskps((int)(root.ptr & 0xfffffffffffffff0),auVar27);
            uVar9 = POPCOUNT(uVar11);
            root.ptr = sVar12;
          } while ((byte)uVar19 < (byte)uVar9);
          pNVar20->ptr = sVar12;
          pNVar20 = pNVar20 + 1;
          (pvVar22->field_0).v[0] = fVar71;
          (pvVar22->field_0).v[1] = fVar76;
          (pvVar22->field_0).v[2] = fVar35;
          (pvVar22->field_0).v[3] = fVar80;
          pvVar22 = pvVar22 + 1;
LAB_006bd95e:
          uVar9 = 4;
        }
        else {
          while (uVar17 != 0) {
            sVar12 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> sVar12 & 1) == 0; sVar12 = sVar12 + 1) {
              }
            }
            uVar17 = uVar17 & uVar17 - 1;
            sVar13 = sVar12;
            valid_i = (vint<4> *)This;
            bVar8 = occluded1(This,bvh,root,sVar12,&pre,ray,&tray,context);
            if (bVar8) {
              terminated.field_0.i[sVar12] = -1;
            }
          }
          uVar68 = movmskps((int)sVar13,(undefined1  [16])terminated.field_0);
          sVar13 = (size_t)uVar68;
          uVar9 = 3;
          fVar37 = INFINITY;
          fVar44 = INFINITY;
          fVar46 = INFINITY;
          fVar48 = INFINITY;
          if (uVar68 != 0xf) {
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f45a40,
                          (undefined1  [16])terminated.field_0);
            uVar9 = 2;
          }
          if (uVar19 < uVar10) goto LAB_006bd7c7;
        }
        pvVar21 = pvVar22;
      } while (uVar9 != 3);
LAB_006bded3:
      auVar31._0_4_ = uVar36 & terminated.field_0.i[0];
      auVar31._4_4_ = uVar43 & terminated.field_0.i[1];
      auVar31._8_4_ = auVar39._8_4_ & terminated.field_0.i[2];
      auVar31._12_4_ = auVar39._12_4_ & terminated.field_0.i[3];
      auVar55 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f45a40,auVar31);
      *(undefined1 (*) [16])(ray + 0x80) = auVar55;
    }
  }
  return;
LAB_006bda42:
  do {
    if (sVar13 == sVar12) break;
    lVar16 = -0x10;
    auVar67 = local_18c8;
    do {
      if (lVar16 == 0) break;
      uVar17 = (ulong)*(uint *)(lVar18 + 0x10 + lVar16);
      valid_i = (vint<4> *)0xffffffff;
      if (uVar17 == 0xffffffff) break;
      fVar37 = *(float *)(lVar18 + -0x80 + lVar16);
      fVar44 = *(float *)(lVar18 + -0x70 + lVar16);
      fVar46 = *(float *)(lVar18 + -0x60 + lVar16);
      local_1878 = (float)*(undefined8 *)ray;
      fStack_1874 = (float)((ulong)*(undefined8 *)ray >> 0x20);
      fStack_1870 = (float)*(undefined8 *)(ray + 8);
      fStack_186c = (float)((ulong)*(undefined8 *)(ray + 8) >> 0x20);
      local_1878 = fVar37 - local_1878;
      fStack_1874 = fVar37 - fStack_1874;
      fStack_1870 = fVar37 - fStack_1870;
      fVar37 = fVar37 - fStack_186c;
      local_1888 = (float)*(undefined8 *)(ray + 0x10);
      fStack_1884 = (float)((ulong)*(undefined8 *)(ray + 0x10) >> 0x20);
      fStack_1880 = (float)*(undefined8 *)(ray + 0x18);
      fStack_187c = (float)((ulong)*(undefined8 *)(ray + 0x18) >> 0x20);
      local_1888 = fVar44 - local_1888;
      fStack_1884 = fVar44 - fStack_1884;
      fStack_1880 = fVar44 - fStack_1880;
      fVar44 = fVar44 - fStack_187c;
      local_16e8 = (float)*(undefined8 *)(ray + 0x20);
      fStack_16e4 = (float)((ulong)*(undefined8 *)(ray + 0x20) >> 0x20);
      fStack_16e0 = (float)*(undefined8 *)(ray + 0x28);
      fStack_16dc = (float)((ulong)*(undefined8 *)(ray + 0x28) >> 0x20);
      local_16e8 = fVar46 - local_16e8;
      fStack_16e4 = fVar46 - fStack_16e4;
      fStack_16e0 = fVar46 - fStack_16e0;
      fVar46 = fVar46 - fStack_16dc;
      fVar48 = *(float *)(lVar18 + -0x50 + lVar16);
      fVar71 = *(float *)(lVar18 + -0x40 + lVar16);
      fVar76 = *(float *)(lVar18 + -0x30 + lVar16);
      fVar35 = *(float *)(lVar18 + -0x20 + lVar16);
      fVar80 = *(float *)(lVar18 + -0x10 + lVar16);
      fVar78 = *(float *)(lVar18 + lVar16);
      fVar33 = fVar76 * fVar80 - fVar71 * fVar78;
      fVar51 = fVar78 * fVar48 - fVar76 * fVar35;
      fVar38 = fVar35 * fVar71 - fVar80 * fVar48;
      local_16f8 = (float)*(undefined8 *)(ray + 0x50);
      fStack_16f4 = (float)((ulong)*(undefined8 *)(ray + 0x50) >> 0x20);
      fStack_16f0 = (float)*(undefined8 *)(ray + 0x58);
      fStack_16ec = (float)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
      local_1708 = (float)*(undefined8 *)(ray + 0x60);
      fStack_1704 = (float)((ulong)*(undefined8 *)(ray + 0x60) >> 0x20);
      fStack_1700 = (float)*(undefined8 *)(ray + 0x68);
      fStack_16fc = (float)((ulong)*(undefined8 *)(ray + 0x68) >> 0x20);
      fVar58 = local_1888 * local_1708 - local_16e8 * local_16f8;
      fVar59 = fStack_1884 * fStack_1704 - fStack_16e4 * fStack_16f4;
      fVar60 = fStack_1880 * fStack_1700 - fStack_16e0 * fStack_16f0;
      fVar62 = fVar44 * fStack_16fc - fVar46 * fStack_16ec;
      local_1718 = (float)*(undefined8 *)(ray + 0x40);
      fStack_1714 = (float)((ulong)*(undefined8 *)(ray + 0x40) >> 0x20);
      fStack_1710 = (float)*(undefined8 *)(ray + 0x48);
      fStack_170c = (float)((ulong)*(undefined8 *)(ray + 0x48) >> 0x20);
      fVar63 = local_16e8 * local_1718 - local_1878 * local_1708;
      fVar64 = fStack_16e4 * fStack_1714 - fStack_1874 * fStack_1704;
      fVar70 = fStack_16e0 * fStack_1710 - fStack_1870 * fStack_1700;
      fVar75 = fVar46 * fStack_170c - fVar37 * fStack_16fc;
      fVar52 = local_1878 * local_16f8 - local_1888 * local_1718;
      fVar53 = fStack_1874 * fStack_16f4 - fStack_1884 * fStack_1714;
      fVar54 = fStack_1870 * fStack_16f0 - fStack_1880 * fStack_1710;
      fVar57 = fVar37 * fStack_16ec - fVar44 * fStack_170c;
      fVar45 = fVar33 * local_1718 + fVar51 * local_16f8 + fVar38 * local_1708;
      fVar47 = fVar33 * fStack_1714 + fVar51 * fStack_16f4 + fVar38 * fStack_1704;
      fVar49 = fVar33 * fStack_1710 + fVar51 * fStack_16f0 + fVar38 * fStack_1700;
      fVar50 = fVar33 * fStack_170c + fVar51 * fStack_16ec + fVar38 * fStack_16fc;
      uVar83 = (uint)fVar45 & 0x80000000;
      uVar86 = (uint)fVar47 & 0x80000000;
      uVar87 = (uint)fVar49 & 0x80000000;
      uVar88 = (uint)fVar50 & 0x80000000;
      fVar23 = (float)((uint)(fVar35 * fVar58 + fVar80 * fVar63 + fVar78 * fVar52) ^ uVar83);
      fVar32 = (float)((uint)(fVar35 * fVar59 + fVar80 * fVar64 + fVar78 * fVar53) ^ uVar86);
      fVar34 = (float)((uint)(fVar35 * fVar60 + fVar80 * fVar70 + fVar78 * fVar54) ^ uVar87);
      fVar35 = (float)((uint)(fVar35 * fVar62 + fVar80 * fVar75 + fVar78 * fVar57) ^ uVar88);
      uVar79 = auVar67._0_4_;
      uVar81 = auVar67._8_4_;
      uVar82 = auVar67._12_4_;
      auVar74._0_4_ = -(uint)(0.0 <= fVar23) & uVar79;
      auVar74._4_4_ = -(uint)(0.0 <= fVar32) & auVar67._4_4_;
      auVar74._8_4_ = -(uint)(0.0 <= fVar34) & uVar81;
      auVar74._12_4_ = -(uint)(0.0 <= fVar35) & uVar82;
      iVar14 = movmskps(0xffffffff,auVar74);
      local_1918 = (uint)uVar6;
      uStack_1914 = SUB84(uVar6,4);
      uStack_1910 = (uint)uVar7;
      uStack_190c = SUB84(uVar7,4);
      uVar9 = local_1918;
      uVar10 = uStack_1914;
      uVar68 = uStack_1910;
      uVar69 = uStack_190c;
      if (iVar14 != 0) {
        fVar80 = (float)((uint)(fVar48 * fVar58 + fVar71 * fVar63 + fVar76 * fVar52) ^ uVar83);
        fVar78 = (float)((uint)(fVar48 * fVar59 + fVar71 * fVar64 + fVar76 * fVar53) ^ uVar86);
        fVar52 = (float)((uint)(fVar48 * fVar60 + fVar71 * fVar70 + fVar76 * fVar54) ^ uVar87);
        fVar48 = (float)((uint)(fVar48 * fVar62 + fVar71 * fVar75 + fVar76 * fVar57) ^ uVar88);
        uVar89 = -(uint)(0.0 <= fVar80) & auVar74._0_4_;
        uVar90 = -(uint)(0.0 <= fVar78) & auVar74._4_4_;
        uVar91 = -(uint)(0.0 <= fVar52) & auVar74._8_4_;
        uVar92 = -(uint)(0.0 <= fVar48) & auVar74._12_4_;
        auVar4._4_4_ = uVar90;
        auVar4._0_4_ = uVar89;
        auVar4._8_4_ = uVar91;
        auVar4._12_4_ = uVar92;
        iVar14 = movmskps(iVar14,auVar4);
        if (iVar14 != 0) {
          fVar71 = ABS(fVar45);
          fVar76 = ABS(fVar47);
          fVar53 = ABS(fVar49);
          fVar54 = ABS(fVar50);
          uVar89 = -(uint)(fVar80 <= fVar71 - fVar23) & uVar89;
          uVar90 = -(uint)(fVar78 <= fVar76 - fVar32) & uVar90;
          uVar91 = -(uint)(fVar52 <= fVar53 - fVar34) & uVar91;
          uVar92 = -(uint)(fVar48 <= fVar54 - fVar35) & uVar92;
          auVar5._4_4_ = uVar90;
          auVar5._0_4_ = uVar89;
          auVar5._8_4_ = uVar91;
          auVar5._12_4_ = uVar92;
          iVar14 = movmskps(iVar14,auVar5);
          if (iVar14 != 0) {
            fVar48 = (float)(uVar83 ^ (uint)(local_1878 * fVar33 +
                                            local_1888 * fVar51 + fVar38 * local_16e8));
            fVar35 = (float)(uVar86 ^ (uint)(fStack_1874 * fVar33 +
                                            fStack_1884 * fVar51 + fVar38 * fStack_16e4));
            fVar80 = (float)(uVar87 ^ (uint)(fStack_1870 * fVar33 +
                                            fStack_1880 * fVar51 + fVar38 * fStack_16e0));
            fVar37 = (float)(uVar88 ^ (uint)(fVar37 * fVar33 + fVar44 * fVar51 + fVar38 * fVar46));
            local_1748 = (float)*(undefined8 *)(ray + 0x30);
            fStack_1744 = (float)((ulong)*(undefined8 *)(ray + 0x30) >> 0x20);
            fStack_1740 = (float)*(undefined8 *)(ray + 0x38);
            fStack_173c = (float)((ulong)*(undefined8 *)(ray + 0x38) >> 0x20);
            local_1758 = (float)*(undefined8 *)(ray + 0x80);
            fStack_1754 = (float)((ulong)*(undefined8 *)(ray + 0x80) >> 0x20);
            fStack_1750 = (float)*(undefined8 *)(ray + 0x88);
            fStack_174c = (float)((ulong)*(undefined8 *)(ray + 0x88) >> 0x20);
            uVar89 = -(uint)(fVar48 <= fVar71 * local_1758 && fVar71 * local_1748 < fVar48) & uVar89
            ;
            uVar90 = -(uint)(fVar35 <= fVar76 * fStack_1754 && fVar76 * fStack_1744 < fVar35) &
                     uVar90;
            uVar91 = -(uint)(fVar80 <= fVar53 * fStack_1750 && fVar53 * fStack_1740 < fVar80) &
                     uVar91;
            uVar92 = -(uint)(fVar54 * fStack_173c < fVar37 && fVar37 <= fVar54 * fStack_174c) &
                     uVar92;
            auVar3._4_4_ = uVar90;
            auVar3._0_4_ = uVar89;
            auVar3._8_4_ = uVar91;
            auVar3._12_4_ = uVar92;
            iVar14 = movmskps(iVar14,auVar3);
            if (iVar14 != 0) {
              auVar56._0_4_ = -(uint)(fVar45 != 0.0) & uVar89;
              auVar56._4_4_ = -(uint)(fVar47 != 0.0) & uVar90;
              auVar56._8_4_ = -(uint)(fVar49 != 0.0) & uVar91;
              auVar56._12_4_ = -(uint)(fVar50 != 0.0) & uVar92;
              iVar14 = movmskps(iVar14,auVar56);
              uVar9 = auVar56._0_4_;
              uVar10 = auVar56._4_4_;
              uVar68 = auVar56._8_4_;
              uVar69 = auVar56._12_4_;
              if (iVar14 == 0) {
                uVar9 = local_1918;
                uVar10 = uStack_1914;
                uVar68 = uStack_1910;
                uVar69 = uStack_190c;
              }
            }
          }
        }
      }
      pGVar2 = (context->scene->geometries).items[uVar17].ptr;
      uVar83 = pGVar2->mask;
      local_1728 = (uint)*(undefined8 *)(ray + 0x90);
      uStack_1724 = (uint)((ulong)*(undefined8 *)(ray + 0x90) >> 0x20);
      uStack_1720 = (uint)*(undefined8 *)(ray + 0x98);
      uStack_171c = (uint)((ulong)*(undefined8 *)(ray + 0x98) >> 0x20);
      auVar29._0_4_ = -(uint)((uVar83 & local_1728) == 0);
      auVar29._4_4_ = -(uint)((uVar83 & uStack_1724) == 0);
      auVar29._8_4_ = -(uint)((uVar83 & uStack_1720) == 0);
      auVar29._12_4_ = -(uint)((uVar83 & uStack_171c) == 0);
      auVar30._4_4_ = uVar10;
      auVar30._0_4_ = uVar9;
      auVar30._8_4_ = uVar68;
      auVar30._12_4_ = uVar69;
      auVar30 = ~auVar29 & auVar30;
      iVar14 = movmskps((int)pGVar2,auVar30);
      if (iVar14 != 0) {
        auVar67._4_4_ = ~auVar30._4_4_ & auVar67._4_4_;
        auVar67._0_4_ = ~auVar30._0_4_ & uVar79;
        auVar67._8_4_ = ~auVar30._8_4_ & uVar81;
        auVar67._12_4_ = ~auVar30._12_4_ & uVar82;
      }
      fVar37 = INFINITY;
      fVar44 = INFINITY;
      fVar46 = INFINITY;
      fVar48 = INFINITY;
      uVar9 = movmskps(iVar14,auVar67);
      valid_i = (vint<4> *)(ulong)uVar9;
      lVar16 = lVar16 + 4;
    } while (uVar9 != 0);
    local_18c8._0_4_ = local_18c8._0_4_ & auVar67._0_4_;
    local_18c8._4_4_ = local_18c8._4_4_ & auVar67._4_4_;
    local_18c8._8_4_ = local_18c8._8_4_ & auVar67._8_4_;
    local_18c8._12_4_ = local_18c8._12_4_ & auVar67._12_4_;
    iVar14 = movmskps((int)lVar16,local_18c8);
    sVar13 = sVar13 + 1;
    lVar18 = lVar18 + 0xb0;
  } while (iVar14 != 0);
  auVar42._0_8_ = local_18c8._0_8_ ^ 0xffffffffffffffff;
  auVar42._8_4_ = local_18c8._8_4_ ^ 0xffffffff;
  auVar42._12_4_ = local_18c8._12_4_ ^ 0xffffffff;
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       ((undefined1  [16])terminated.field_0 | auVar42);
  uVar9 = movmskps((int)sVar12,(undefined1  [16])terminated.field_0);
  if (uVar9 == 0xf) goto LAB_006bded3;
  tray.tfar.field_0 =
       (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
       blendvps((undefined1  [16])tray.tfar.field_0,_DAT_01f45a40,
                (undefined1  [16])terminated.field_0);
  goto LAB_006bd787;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }